

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_unregister_works_with_different_object_Test::TestBody
          (SubjectSetRegisterTest_test_unregister_works_with_different_object_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  Subject subject2;
  Subject subject1;
  SubjectSetRegister subject_register;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  AssertHelper local_120;
  internal local_118 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  SubjectSetRegister local_a0 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_70 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_40 [48];
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR,BuySideId=1A78668,Level=1,NumAllocs=1,Symbol=EURGBP,Quantity=1000000.00,RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109"
             ,"");
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR,BuySideId=1A78668,Level=1,NumAllocs=1,Symbol=EURGBP,Quantity=1000000.00,RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109"
             ,"");
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  bVar2 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)local_a0);
  local_118[0] = (internal)(bVar2 ^ 1);
  local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,local_118,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject1)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x19f,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)local_a0);
  local_118[0] = (internal)(bVar2 ^ 1);
  local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,local_118,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a0,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_b8,(Subject *)&local_d0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,&local_b8,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  local_118[0] = (internal)
                 bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                           ((Subject *)local_a0);
  local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,local_118,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject1)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a2,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = (internal)
                 bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                           ((Subject *)local_a0);
  local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,local_118,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject2)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a3,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bVar2 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)local_a0);
  local_118[0] = (internal)(bVar2 ^ 1);
  local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,local_118,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject1)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a5,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)local_a0);
  local_118[0] = (internal)(bVar2 ^ 1);
  local_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,local_118,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a6,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::~_Rb_tree(local_40);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::~_Rb_tree(local_70);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_unregister_works_with_different_object)
{
    SubjectSetRegister subject_register = SubjectSetRegister();

    const Subject subject1 = SubjectUtils::CreateSubjectFromString(
            "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR"
            ",BuySideId=1A78668,Level=1,NumAllocs=1"
            ",Symbol=EURGBP,Quantity=1000000.00"
            ",RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109");

    const Subject subject2 = SubjectUtils::CreateSubjectFromString(
            "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR"
            ",BuySideId=1A78668,Level=1,NumAllocs=1"
            ",Symbol=EURGBP,Quantity=1000000.00"
            ",RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109");


    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject2));
    subject_register.Register(subject1, false);
    EXPECT_TRUE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_TRUE(subject_register.IsCurrentlySubscribed(subject2));
    subject_register.Unregister(subject2);
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject2));
}